

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O3

void icetStateSetDefaults(void)

{
  undefined1 auVar1 [16];
  IceTTimeStamp IVar2;
  uint num_entries;
  int iVar3;
  IceTState pIVar4;
  IceTVoid *pIVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 local_20;
  
  icetDiagnostics(0x103);
  num_entries = icetCommSize();
  iVar3 = icetCommRank();
  local_20._0_4_ = iVar3;
  stateSet(2,1,0x8003,&local_20);
  local_20._0_4_ = num_entries;
  stateSet(3,1,0x8003,&local_20);
  stateSet(5,4,0x8004,black);
  local_20._0_4_ = 0;
  stateSet(6,1,0x8003,&local_20);
  local_20._0_4_ = 0xc001;
  stateSet(9,1,0x8003,&local_20);
  local_20._0_4_ = 0xd001;
  stateSet(10,1,0x8003,&local_20);
  icetResetTiles();
  icetTypeWidth(0x8003);
  pIVar4 = icetGetState();
  if ((pIVar4[0x1a].num_entries != 0) || (pIVar4[0x1a].type != 0x8003)) {
    pIVar4[0x1a].type = 0x8003;
    pIVar4[0x1a].num_entries = 0;
    pIVar4[0x1a].data = (void *)0x0;
  }
  IVar2 = icetGetTimeStamp::current_time + 1;
  pIVar4[0x1a].mod_time = icetGetTimeStamp::current_time;
  icetGetTimeStamp::current_time = IVar2;
  icetTypeWidth(0x8005);
  pIVar4 = icetGetState();
  if ((pIVar4[0x22].num_entries != 0) || (pIVar4[0x22].type != 0x8005)) {
    pIVar4[0x22].type = 0x8005;
    pIVar4[0x22].num_entries = 0;
    pIVar4[0x22].data = (void *)0x0;
  }
  IVar2 = icetGetTimeStamp::current_time + 1;
  pIVar4[0x22].mod_time = icetGetTimeStamp::current_time;
  icetGetTimeStamp::current_time = IVar2;
  local_20._0_4_ = 0;
  stateSet(0x23,1,0x8003,&local_20);
  local_20._0_4_ = 0xffffffff;
  stateSet(0x24,1,0x8003,&local_20);
  icetSingleImageStrategy(0x7001);
  icetCompositeMode(0x301);
  pIVar4 = icetGetState();
  pIVar5 = stateAllocate(0x29,num_entries,0x8003,pIVar4);
  auVar1 = _DAT_0011c1f0;
  if (0 < (int)num_entries) {
    lVar8 = (ulong)num_entries - 1;
    auVar9._8_4_ = (int)lVar8;
    auVar9._0_8_ = lVar8;
    auVar9._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar7 = 0;
    auVar9 = auVar9 ^ _DAT_0011c1f0;
    auVar12 = _DAT_0011c1e0;
    do {
      auVar11 = auVar12 ^ auVar1;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        *(int *)((long)pIVar5 + uVar7 * 4) = (int)uVar7;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        *(int *)((long)pIVar5 + uVar7 * 4 + 4) = (int)uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar8 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar8 + 2;
    } while ((num_entries + 1 & 0xfffffffe) != uVar7);
  }
  pIVar4 = icetGetState();
  pIVar5 = stateAllocate(0x2a,num_entries,0x8003,pIVar4);
  auVar1 = _DAT_0011c1f0;
  if (0 < (int)num_entries) {
    lVar8 = (ulong)num_entries - 1;
    auVar10._8_4_ = (int)lVar8;
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar7 = 0;
    auVar10 = auVar10 ^ _DAT_0011c1f0;
    auVar11 = _DAT_0011c1e0;
    do {
      auVar12 = auVar11 ^ auVar1;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        *(int *)((long)pIVar5 + uVar7 * 4) = (int)uVar7;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        *(int *)((long)pIVar5 + uVar7 * 4 + 4) = (int)uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar8 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar8 + 2;
    } while ((num_entries + 1 & 0xfffffffe) != uVar7);
  }
  local_20._0_4_ = iVar3;
  stateSet(0x2c,1,0x8003,&local_20);
  local_20._0_4_ = 1;
  stateSet(0x2d,1,0x8003,&local_20);
  local_20._0_4_ = 0;
  stateSet(0x2e,1,0x8003,&local_20);
  pcVar6 = getenv("ICET_MAGIC_K");
  if (pcVar6 == (char *)0x0) {
LAB_0010a10c:
    local_20._0_4_ = 8;
    iVar3 = (uint)local_20;
  }
  else {
    iVar3 = atoi(pcVar6);
    if (iVar3 < 2) {
      icetRaiseDiagnostic("Environment varible ICET_MAGIC_K must be set to an integer greater than 1."
                          ,0xfffffffa,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                          ,0xa6);
      goto LAB_0010a10c;
    }
  }
  local_20._0_4_ = iVar3;
  stateSet(0x40,1,0x8003,&local_20);
  pcVar6 = getenv("ICET_MAX_IMAGE_SPLIT");
  if (pcVar6 != (char *)0x0) {
    iVar3 = atoi(pcVar6);
    if (0 < iVar3) {
      local_20 = CONCAT44(local_20._4_4_,iVar3);
      goto LAB_0010a17f;
    }
    icetRaiseDiagnostic("Environment variable ICET_MAX_IMAGE_SPLIT must be set to an integer greater than 0."
                        ,0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0xb4);
  }
  local_20 = CONCAT44(local_20._4_4_,0x200);
LAB_0010a17f:
  stateSet(0x41,1,0x8003,&local_20);
  local_20 = 0;
  stateSet(0x60,1,0x8008,&local_20);
  local_20 = 0;
  stateSet(0x61,1,0x8008,&local_20);
  local_20._0_1_ = 1;
  stateSet(0x141,1,0x8000,&local_20);
  local_20._0_1_ = 0;
  stateSet(0x142,1,0x8000,&local_20);
  local_20._0_1_ = 0;
  stateSet(0x143,1,0x8000,&local_20);
  local_20._0_1_ = 1;
  stateSet(0x144,1,0x8000,&local_20);
  local_20._0_1_ = 1;
  stateSet(0x145,1,0x8000,&local_20);
  local_20._0_1_ = 1;
  stateSet(0x146,1,0x8000,&local_20);
  local_20._0_1_ = 0;
  stateSet(0x80,1,0x8000,&local_20);
  local_20 = (ulong)local_20._1_7_ << 8;
  stateSet(0x92,1,0x8000,&local_20);
  local_20._0_4_ = 0xffffffff;
  stateSet(0x8c,1,0x8003,&local_20);
  local_20._0_4_ = 0;
  stateSet(0x8d,1,0x8003,&local_20);
  local_20 = (ulong)local_20._4_4_ << 0x20;
  stateSet(0x8e,1,0x8003,&local_20);
  icetStateResetTiming();
  return;
}

Assistant:

void icetStateSetDefaults(void)
{
    IceTInt *int_array;
    int i;
    int comm_size, comm_rank;

    icetDiagnostics(ICET_DIAG_ALL_NODES | ICET_DIAG_WARNINGS);

    comm_size = icetCommSize();
    comm_rank = icetCommRank();
    icetStateSetInteger(ICET_RANK, comm_rank);
    icetStateSetInteger(ICET_NUM_PROCESSES, comm_size);
    /* icetStateSetInteger(ICET_ABSOLUTE_FAR_DEPTH, 1); */
  /*icetStateSetInteger(ICET_ABSOLUTE_FAR_DEPTH, 0xFFFFFFFF);*/
    icetStateSetFloatv(ICET_BACKGROUND_COLOR, 4, black);
    icetStateSetInteger(ICET_BACKGROUND_COLOR_WORD, 0);
    icetStateSetInteger(ICET_COLOR_FORMAT, ICET_IMAGE_COLOR_RGBA_UBYTE);
    icetStateSetInteger(ICET_DEPTH_FORMAT, ICET_IMAGE_DEPTH_FLOAT);

    icetResetTiles();
    icetStateSetIntegerv(ICET_DISPLAY_NODES, 0, NULL);

    icetStateSetDoublev(ICET_GEOMETRY_BOUNDS, 0, NULL);
    icetStateSetInteger(ICET_NUM_BOUNDING_VERTS, 0);
    icetStateSetInteger(ICET_STRATEGY, ICET_STRATEGY_UNDEFINED);
    icetSingleImageStrategy(ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC);
    icetCompositeMode(ICET_COMPOSITE_MODE_Z_BUFFER);
    int_array = icetStateAllocateInteger(ICET_COMPOSITE_ORDER, comm_size);
    for (i = 0; i < comm_size; i++) {
        int_array[i] = i;
    }
    int_array = icetStateAllocateInteger(ICET_PROCESS_ORDERS, comm_size);
    for (i = 0; i < comm_size; i++) {
        int_array[i] = i;
    }

    icetStateSetInteger(ICET_DATA_REPLICATION_GROUP, comm_rank);
    icetStateSetInteger(ICET_DATA_REPLICATION_GROUP_SIZE, 1);
    icetStateSetInteger(ICET_FRAME_COUNT, 0);

    if (getenv("ICET_MAGIC_K") != NULL) {
        IceTInt magic_k = atoi(getenv("ICET_MAGIC_K"));
        if (magic_k > 1) {
            icetStateSetInteger(ICET_MAGIC_K, magic_k);
        } else {
            icetRaiseError("Environment varible ICET_MAGIC_K must be set"
                           " to an integer greater than 1.",
                           ICET_INVALID_VALUE);
            icetStateSetInteger(ICET_MAGIC_K, ICET_MAGIC_K_DEFAULT);
        }
    } else {
        icetStateSetInteger(ICET_MAGIC_K, ICET_MAGIC_K_DEFAULT);
    }

    if (getenv("ICET_MAX_IMAGE_SPLIT") != NULL) {
        IceTInt max_image_split = atoi(getenv("ICET_MAX_IMAGE_SPLIT"));
        if (max_image_split > 0) {
            icetStateSetInteger(ICET_MAX_IMAGE_SPLIT, max_image_split);
        } else {
            icetRaiseError("Environment variable ICET_MAX_IMAGE_SPLIT must be"
                           " set to an integer greater than 0.",
                           ICET_INVALID_VALUE);
            icetStateSetInteger(ICET_MAX_IMAGE_SPLIT,
                                ICET_MAX_IMAGE_SPLIT_DEFAULT);
        }
    } else {
        icetStateSetInteger(ICET_MAX_IMAGE_SPLIT, ICET_MAX_IMAGE_SPLIT_DEFAULT);
    }

    icetStateSetPointer(ICET_DRAW_FUNCTION, NULL);
    icetStateSetPointer(ICET_RENDER_LAYER_DESTRUCTOR, NULL);

    icetEnable(ICET_FLOATING_VIEWPORT);
    icetDisable(ICET_ORDERED_COMPOSITE);
    icetDisable(ICET_CORRECT_COLORED_BACKGROUND);
    icetEnable(ICET_COMPOSITE_ONE_BUFFER);
    icetEnable(ICET_INTERLACE_IMAGES);
    icetEnable(ICET_COLLECT_IMAGES);

    icetStateSetBoolean(ICET_IS_DRAWING_FRAME, 0);
    icetStateSetBoolean(ICET_RENDER_BUFFER_SIZE, 0);

    icetStateSetInteger(ICET_VALID_PIXELS_TILE, -1);
    icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
    icetStateSetInteger(ICET_VALID_PIXELS_NUM, 0);

    icetStateResetTiming();
}